

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::
basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::basic_json_encoder
          (basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this,string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *sink,basic_json_encode_options<char> *options,allocator<char> *alloc)

{
  char cVar1;
  spaces_option sVar2;
  bool bVar3;
  basic_json_encode_options<char> *in_RDX;
  basic_json_visitor<char> *in_RDI;
  allocator_type *in_stack_fffffffffffffcc8;
  allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>
  *in_stack_fffffffffffffcd0;
  string *this_00;
  basic_json_encode_options<char> *in_stack_fffffffffffffcd8;
  allocator<char> *paVar4;
  basic_json_encode_options<char> *in_stack_fffffffffffffce0;
  allocator<char> local_25b;
  undefined1 local_25a;
  undefined1 local_259;
  undefined1 *local_258;
  undefined8 local_250;
  string local_248 [37];
  allocator<char> local_223;
  undefined1 local_222;
  undefined1 local_221;
  undefined1 *local_220;
  undefined8 local_218;
  string local_210 [37];
  allocator<char> local_1eb;
  undefined1 local_1ea;
  undefined1 local_1e9;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  string local_1d8 [37];
  allocator<char> local_1b3;
  undefined1 local_1b2;
  undefined1 local_1b1;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  string local_1a0 [36];
  allocator<char> local_17c;
  undefined1 local_17b;
  undefined1 local_17a;
  undefined1 local_179;
  undefined1 *local_178;
  undefined8 local_170;
  string local_168 [37];
  allocator<char> local_143;
  undefined1 local_142;
  undefined1 local_141;
  undefined1 *local_140;
  undefined8 local_138;
  string local_130 [37];
  allocator<char> local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  undefined1 *local_108;
  undefined8 local_100;
  string local_f8 [36];
  allocator<char> local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 *local_d0;
  undefined8 local_c8;
  string local_c0 [37];
  allocator<char> local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined1 *local_98;
  undefined8 local_90;
  string local_88 [37];
  allocator<char> local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 *local_60;
  undefined8 local_58;
  string local_50 [56];
  basic_json_encode_options<char> *local_18;
  
  local_18 = in_RDX;
  basic_json_visitor<char>::basic_json_visitor(in_RDI);
  in_RDI->_vptr_basic_json_visitor = (_func_int **)&PTR__basic_json_encoder_01337390;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  string_sink((string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffcd0,
              (string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffcc8);
  basic_json_encode_options<char>::basic_json_encode_options
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  basic_json_encode_options<char>::float_format(local_18);
  basic_json_encode_options<char>::precision(local_18);
  detail::write_double::write_double
            ((write_double *)in_stack_fffffffffffffce0,
             (float_chars_format)((ulong)in_stack_fffffffffffffcd8 >> 0x38),
             (int)in_stack_fffffffffffffcd8);
  std::
  allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>
  ::allocator<char>(in_stack_fffffffffffffcd0,(allocator<char> *)in_stack_fffffffffffffcc8);
  std::
  vector<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
  ::vector((vector<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
            *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  std::
  allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>
  ::~allocator((allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>
                *)0x31482d);
  *(undefined4 *)&in_RDI[0x2e]._vptr_basic_json_visitor = 0;
  in_RDI[0x2f]._vptr_basic_json_visitor = (_func_int **)0x0;
  std::__cxx11::string::string((string *)(in_RDI + 0x30));
  std::__cxx11::string::string((string *)(in_RDI + 0x34));
  std::__cxx11::string::string((string *)(in_RDI + 0x38));
  std::__cxx11::string::string((string *)(in_RDI + 0x3c));
  std::__cxx11::string::string((string *)(in_RDI + 0x40));
  std::__cxx11::string::string((string *)(in_RDI + 0x44));
  *(undefined4 *)&in_RDI[0x48]._vptr_basic_json_visitor = 0;
  sVar2 = basic_json_encode_options<char>::spaces_around_colon(local_18);
  cVar1 = (char)in_RDI;
  if (sVar2 == space_after) {
    local_62 = 0x3a;
    local_61 = 0x20;
    local_60 = &local_62;
    local_58 = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,local_60,local_58,&local_63);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x30),local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_63);
  }
  else if (sVar2 == space_before) {
    local_9a = 0x20;
    local_99 = 0x3a;
    local_98 = &local_9a;
    local_90 = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,local_98,local_90,&local_9b);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x30),local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_9b);
  }
  else if (sVar2 == space_before_and_after) {
    local_d3 = 0x20;
    local_d2 = 0x3a;
    local_d1 = 0x20;
    local_d0 = &local_d3;
    local_c8 = 3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,local_d0,local_c8,&local_d4);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x30),local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator(&local_d4);
  }
  else {
    std::__cxx11::string::push_back(cVar1 + -0x80);
  }
  sVar2 = basic_json_encode_options<char>::spaces_around_comma(local_18);
  if (sVar2 == space_after) {
    local_10a = 0x2c;
    local_109 = 0x20;
    local_108 = &local_10a;
    local_100 = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,local_108,local_100,&local_10b);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x34),local_f8);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_10b);
  }
  else if (sVar2 == space_before) {
    local_142 = 0x20;
    local_141 = 0x2c;
    local_140 = &local_142;
    local_138 = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,local_140,local_138,&local_143);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x34),local_130);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator(&local_143);
  }
  else if (sVar2 == space_before_and_after) {
    local_17b = 0x20;
    local_17a = 0x2c;
    local_179 = 0x20;
    local_178 = &local_17b;
    local_170 = 3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,local_178,local_170,&local_17c);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x34),local_168);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator(&local_17c);
  }
  else {
    std::__cxx11::string::push_back(cVar1 + -0x60);
  }
  bVar3 = basic_json_encode_options<char>::pad_inside_object_braces(local_18);
  if (bVar3) {
    local_1b2 = 0x7b;
    local_1b1 = 0x20;
    local_1b0 = &local_1b2;
    local_1a8 = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,local_1b0,local_1a8,&local_1b3);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x38),local_1a0);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator(&local_1b3);
    local_1ea = 0x20;
    local_1e9 = 0x7d;
    local_1e8 = &local_1ea;
    local_1e0 = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,local_1e8,local_1e0,&local_1eb);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x3c),local_1d8);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator(&local_1eb);
  }
  else {
    std::__cxx11::string::push_back(cVar1 + -0x40);
    std::__cxx11::string::push_back(cVar1 + -0x20);
  }
  bVar3 = basic_json_encode_options<char>::pad_inside_array_brackets(local_18);
  if (bVar3) {
    local_222 = 0x5b;
    local_221 = 0x20;
    local_220 = &local_222;
    local_218 = 2;
    paVar4 = &local_223;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,local_220,local_218,paVar4);
    this_00 = local_210;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x40),this_00);
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::~allocator(&local_223);
    local_25a = 0x20;
    local_259 = 0x5d;
    local_258 = &local_25a;
    local_250 = 2;
    paVar4 = &local_25b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,local_258,local_250,paVar4);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x44),local_248);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator(&local_25b);
  }
  else {
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1 + ' ');
  }
  return;
}

Assistant:

basic_json_encoder(Sink&& sink, 
                           const basic_json_encode_options<CharT>& options, 
                           const Allocator& alloc = Allocator())
           : sink_(std::forward<Sink>(sink)), 
             options_(options),
             fp_(options.float_format(), options.precision()),
             stack_(alloc)
        {
            switch (options.spaces_around_colon())
            {
                case spaces_option::space_after:
                    colon_str_ = std::basic_string<CharT>({':',' '});
                    break;
                case spaces_option::space_before:
                    colon_str_ = std::basic_string<CharT>({' ',':'});
                    break;
                case spaces_option::space_before_and_after:
                    colon_str_ = std::basic_string<CharT>({' ',':',' '});
                    break;
                default:
                    colon_str_.push_back(':');
                    break;
            }
            switch (options.spaces_around_comma())
            {
                case spaces_option::space_after:
                    comma_str_ = std::basic_string<CharT>({',',' '});
                    break;
                case spaces_option::space_before:
                    comma_str_ = std::basic_string<CharT>({' ',','});
                    break;
                case spaces_option::space_before_and_after:
                    comma_str_ = std::basic_string<CharT>({' ',',',' '});
                    break;
                default:
                    comma_str_.push_back(',');
                    break;
            }
            if (options.pad_inside_object_braces())
            {
                open_object_brace_str_ = std::basic_string<CharT>({'{', ' '});
                close_object_brace_str_ = std::basic_string<CharT>({' ', '}'});
            }
            else
            {
                open_object_brace_str_.push_back('{');
                close_object_brace_str_.push_back('}');
            }
            if (options.pad_inside_array_brackets())
            {
                open_array_bracket_str_ = std::basic_string<CharT>({'[', ' '});
                close_array_bracket_str_ = std::basic_string<CharT>({' ', ']'});
            }
            else
            {
                open_array_bracket_str_.push_back('[');
                close_array_bracket_str_.push_back(']');
            }
        }